

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O3

void test_one<char>(locale *l,string *src,string *tgtl,string *tgtu)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  converter<char> *pcVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  bool bVar8;
  string local_c0;
  string local_a0;
  string local_80;
  locale local_60 [8];
  locale local_58 [8];
  locale local_50 [8];
  locale local_48 [8];
  locale local_40 [8];
  locale local_38 [8];
  
  test_counter = test_counter + 1;
  std::locale::locale(local_38,l);
  pcVar2 = (src->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_80,pcVar2,pcVar2 + src->_M_string_length,local_38,default_method);
  pcVar5 = std::use_facet<booster::locale::converter<char>>(l);
  (**(code **)(*(long *)pcVar5 + 0x10))
            (&local_c0,pcVar5,1,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length,0);
  std::locale::locale(local_40,l);
  pcVar2 = (tgtu->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_a0,pcVar2,pcVar2 + tgtu->_M_string_length,local_40,default_method);
  _Var3._M_p = local_a0._M_dataplus._M_p;
  if (local_c0._M_string_length == local_a0._M_string_length) {
    if (local_c0._M_string_length == 0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp(local_c0._M_dataplus._M_p,local_a0._M_dataplus._M_p,local_c0._M_string_length);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_a0.field_2) {
    operator_delete(_Var3._M_p);
  }
  std::locale::~locale(local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::locale::~locale(local_38);
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l)"
               ,0x67);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_c0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_48,l);
  pcVar2 = (src->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_80,pcVar2,pcVar2 + src->_M_string_length,local_48,default_method);
  pcVar5 = std::use_facet<booster::locale::converter<char>>(l);
  (**(code **)(*(long *)pcVar5 + 0x10))
            (&local_c0,pcVar5,2,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length,0);
  std::locale::locale(local_50,l);
  pcVar2 = (tgtl->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_a0,pcVar2,pcVar2 + tgtl->_M_string_length,local_50,default_method);
  _Var3._M_p = local_a0._M_dataplus._M_p;
  if (local_c0._M_string_length == local_a0._M_string_length) {
    if (local_c0._M_string_length == 0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp(local_c0._M_dataplus._M_p,local_a0._M_dataplus._M_p,local_c0._M_string_length);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_a0.field_2) {
    operator_delete(_Var3._M_p);
  }
  std::locale::~locale(local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::locale::~locale(local_48);
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
               ,0x67);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_c0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  std::locale::locale(local_58,l);
  pcVar2 = (src->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_80,pcVar2,pcVar2 + src->_M_string_length,local_58,default_method);
  pcVar5 = std::use_facet<booster::locale::converter<char>>(l);
  (**(code **)(*(long *)pcVar5 + 0x10))
            (&local_c0,pcVar5,3,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length,0);
  std::locale::locale(local_60,l);
  pcVar2 = (tgtl->_M_dataplus)._M_p;
  booster::locale::conv::from_utf<char>
            (&local_a0,pcVar2,pcVar2 + tgtl->_M_string_length,local_60,default_method);
  if (local_c0._M_string_length == local_a0._M_string_length) {
    if (local_c0._M_string_length == 0) {
      bVar8 = true;
    }
    else {
      iVar4 = bcmp(local_c0._M_dataplus._M_p,local_a0._M_dataplus._M_p,local_c0._M_string_length);
      bVar8 = iVar4 == 0;
    }
  }
  else {
    bVar8 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::locale::~locale(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  std::locale::~locale(local_58);
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               " booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l)"
               ,0x68);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    iVar4 = error_counter + 1;
    bVar8 = 0x14 < error_counter;
    error_counter = iVar4;
    if (bVar8) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Error limits reached, stopping unit test","");
      booster::runtime_error::runtime_error(prVar7,&local_c0);
      __cxa_throw(prVar7,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void test_one(std::locale const &l,std::string src,std::string tgtl,std::string tgtu)
{
    TEST(booster::locale::to_upper(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtu,l));
    TEST(booster::locale::to_lower(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
    TEST(booster::locale::fold_case(to_correct_string<CharType>(src,l),l) == to_correct_string<CharType>(tgtl,l));
}